

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O2

void __thiscall
wasm::(anonymous_namespace)::GlobalTypeOptimization::updateTypes(wasm::Module&)::TypeRewriter::
modifyStruct(wasm::HeapType,wasm::Struct__(void *this,HeapType oldStructType,Struct *struct_)

{
  key_type *__k;
  pointer pFVar1;
  _Hash_node_base *p_Var2;
  char *pcVar3;
  iterator iVar4;
  iterator iVar5;
  ulong uVar6;
  iterator iVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *__ht;
  reference rVar14;
  undefined1 local_90 [8];
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  oldFieldNames;
  FieldList copy;
  HeapType oldStructType_local;
  value_type newIndex;
  
  copy.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)oldStructType.id;
  iVar4 = std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(*(long *)((long)this + 0x68) + 0x90),
                 (key_type *)
                 &copy.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    for (uVar13 = 0; uVar6 = (ulong)uVar13,
        uVar6 < (ulong)*(uint *)((long)iVar4.
                                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                                       ._M_cur + 0x28) +
                (*(long *)((long)iVar4.
                                 super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                                 ._M_cur + 0x20) -
                *(long *)((long)iVar4.
                                super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                                ._M_cur + 0x10)) * 8; uVar13 = uVar13 + 1) {
      rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          ((long)iVar4.
                                 super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_true>
                                 ._M_cur + 0x10),uVar6);
      if ((*rVar14._M_p & rVar14._M_mask) != 0) {
        (struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6].mutable_ = Immutable;
      }
    }
  }
  iVar5 = std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(*(long *)((long)this + 0x68) + 200),
                 (key_type *)
                 &copy.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
               &oldFieldNames._M_h._M_single_bucket,&struct_->fields);
    uVar13 = 0;
    uVar11 = 0;
    while( true ) {
      uVar6 = (ulong)uVar13;
      pFVar1 = (struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar12 = (long)(struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4;
      if (uVar12 <= uVar6) break;
      uVar12 = (ulong)*(uint *)(*(long *)((long)iVar5.
                                                super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                                                ._M_cur + 0x10) + uVar6 * 4);
      if (uVar12 == 0xffffffff) {
        uVar11 = uVar11 + 1;
      }
      else {
        p_Var2 = (oldFieldNames._M_h._M_single_bucket + uVar6 * 2)[1]._M_nxt;
        pFVar1 = pFVar1 + uVar12;
        (pFVar1->type).id = (uintptr_t)oldFieldNames._M_h._M_single_bucket[uVar6 * 2]._M_nxt;
        *(_Hash_node_base **)&pFVar1->packedType = p_Var2;
      }
      uVar13 = uVar13 + 1;
    }
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::resize(&struct_->fields,uVar12 - uVar11)
    ;
    iVar7 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(*(long *)((long)this + 8) + 400),
                   (key_type *)
                   &copy.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    if (iVar7.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
        _M_cur != (__node_type *)0x0) {
      __ht = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)((long)iVar7.
                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                       ._M_cur + 0x20);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)local_90,__ht);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(__ht);
      oldStructType_local.id._4_4_ = 0;
      __k = (key_type *)((long)&oldStructType_local.id + 4);
      while( true ) {
        if (oldFieldNames._M_h._M_before_begin._M_nxt <=
            (_Hash_node_base *)(ulong)oldStructType_local.id._4_4_) break;
        oldStructType_local.id._0_4_ =
             *(int *)(*(long *)((long)iVar5.
                                      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                                      ._M_cur + 0x10) +
                     (long)(ulong)oldStructType_local.id._4_4_ * 4);
        if ((int)oldStructType_local.id != -1) {
          sVar8 = std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)local_90,__k);
          if (sVar8 != 0) {
            pmVar9 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_90,__k);
            if ((pmVar9->super_IString).str._M_str == (char *)0x0) {
              __assert_fail("oldFieldNames[i].is()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GlobalTypeOptimization.cpp"
                            ,0x1b4,
                            "virtual void wasm::(anonymous namespace)::GlobalTypeOptimization::updateTypes(Module &)::TypeRewriter::modifyStruct(HeapType, Struct &)"
                           );
            }
            pmVar9 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_90,__k);
            pmVar10 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)__ht,(key_type *)&oldStructType_local);
            pcVar3 = (pmVar9->super_IString).str._M_str;
            (pmVar10->super_IString).str._M_len = (pmVar9->super_IString).str._M_len;
            (pmVar10->super_IString).str._M_str = pcVar3;
          }
        }
        oldStructType_local.id._4_4_ = oldStructType_local.id._4_4_ + 1;
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_90);
    }
    std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
              ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)
               &oldFieldNames._M_h._M_single_bucket);
  }
  return;
}

Assistant:

void modifyStruct(HeapType oldStructType, Struct& struct_) override {
        auto& newFields = struct_.fields;

        // Adjust immutability.
        auto immIter = parent.canBecomeImmutable.find(oldStructType);
        if (immIter != parent.canBecomeImmutable.end()) {
          auto& immutableVec = immIter->second;
          for (Index i = 0; i < immutableVec.size(); i++) {
            if (immutableVec[i]) {
              newFields[i].mutable_ = Immutable;
            }
          }
        }

        // Remove/reorder fields where we can.
        auto remIter = parent.indexesAfterRemovals.find(oldStructType);
        if (remIter != parent.indexesAfterRemovals.end()) {
          auto& indexesAfterRemoval = remIter->second;
          Index removed = 0;
          auto copy = newFields;
          for (Index i = 0; i < newFields.size(); i++) {
            auto newIndex = indexesAfterRemoval[i];
            if (newIndex != RemovedField) {
              newFields[newIndex] = copy[i];
            } else {
              removed++;
            }
          }
          newFields.resize(newFields.size() - removed);

          // Update field names as well. The Type Rewriter cannot do this for
          // us, as it does not know which old fields map to which new ones (it
          // just keeps the names in sequence).
          auto iter = wasm.typeNames.find(oldStructType);
          if (iter != wasm.typeNames.end()) {
            auto& nameInfo = iter->second;

            // Make a copy of the old ones to base ourselves off of as we do so.
            auto oldFieldNames = nameInfo.fieldNames;

            // Clear the old names and write the new ones.
            nameInfo.fieldNames.clear();
            for (Index i = 0; i < oldFieldNames.size(); i++) {
              auto newIndex = indexesAfterRemoval[i];
              if (newIndex != RemovedField && oldFieldNames.count(i)) {
                assert(oldFieldNames[i].is());
                nameInfo.fieldNames[newIndex] = oldFieldNames[i];
              }
            }
          }
        }
      }